

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void signFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  uint iVal;
  double dVar2;
  
  iVar1 = sqlite3_value_numeric_type(*argv);
  if (iVar1 - 3U < 0xfffffffe) {
    return;
  }
  dVar2 = sqlite3VdbeRealValue(*argv);
  iVal = 0xffffffff;
  if (0.0 <= dVar2) {
    iVal = (uint)(0.0 < dVar2);
  }
  sqlite3_result_int(context,iVal);
  return;
}

Assistant:

static void signFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int type0;
  double x;
  UNUSED_PARAMETER(argc);
  assert( argc==1 );
  type0 = sqlite3_value_numeric_type(argv[0]);
  if( type0!=SQLITE_INTEGER && type0!=SQLITE_FLOAT ) return;
  x = sqlite3_value_double(argv[0]);
  sqlite3_result_int(context, x<0.0 ? -1 : x>0.0 ? +1 : 0);
}